

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O0

_Bool char_to_hex(uchar *val,char c)

{
  char c_local;
  uchar *val_local;
  
  if ((c < '0') || ('9' < c)) {
    if ((c < 'a') || ('f' < c)) {
      if ((c < 'A') || ('F' < c)) {
        val_local._7_1_ = false;
      }
      else {
        *val = c + 0xc9;
        val_local._7_1_ = true;
      }
    }
    else {
      *val = c + 0xa9;
      val_local._7_1_ = true;
    }
  }
  else {
    *val = c + 0xd0;
    val_local._7_1_ = true;
  }
  return val_local._7_1_;
}

Assistant:

static bool char_to_hex(unsigned char *val, char c)
{
	if (c >= '0' && c <= '9') {
		*val = c - '0';
		return true;
	}
	if (c >= 'a' && c <= 'f') {
		*val = c - 'a' + 10;
		return true;
	}
	if (c >= 'A' && c <= 'F') {
		*val = c - 'A' + 10;
		return true;
	}
	return false;
}